

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

size_t absl::lts_20240722::container_internal::
       TypeErasedApplyToSlotFn<google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::Descriptor_const*>
                 (void *fn,void *slot)

{
  size_t sVar1;
  DescriptorsByNameHash<google::protobuf::Descriptor> *f;
  void *slot_local;
  void *fn_local;
  
  sVar1 = google::protobuf::anon_unknown_23::DescriptorsByNameHash<google::protobuf::Descriptor>::
          operator()((DescriptorsByNameHash<google::protobuf::Descriptor> *)fn,*slot);
  return sVar1;
}

Assistant:

size_t TypeErasedApplyToSlotFn(const void* fn, void* slot) {
  const auto* f = static_cast<const Fn*>(fn);
  return (*f)(*static_cast<const T*>(slot));
}